

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_test.cpp
# Opt level: O0

void jsonnet::internal::anon_unknown_0::testEncodeDecode(char32_t codepoint,string *expect_utf8)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  char32_t cVar5;
  char *pcVar6;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  char32_t decoded;
  size_t at;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t len;
  string buffer;
  string *in_stack_fffffffffffffec8;
  char32_t in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffee4;
  string *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined8 in_stack_fffffffffffffef8;
  Type type;
  undefined7 in_stack_ffffffffffffff00;
  AssertionResult local_d0;
  Message *in_stack_ffffffffffffff48;
  AssertHelper *in_stack_ffffffffffffff50;
  AssertionResult local_80 [2];
  undefined8 local_60;
  AssertionResult local_58 [2];
  long local_38;
  string local_30 [48];
  
  type = (Type)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  std::__cxx11::string::string(local_30);
  iVar4 = encode_utf8(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_38 = (long)iVar4;
  local_60 = std::__cxx11::string::size();
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffee8,
             (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (unsigned_long *)in_stack_fffffffffffffed8,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  uVar1 = testing::AssertionResult::operator_cast_to_bool(local_58);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x1626ef);
    type = (Type)((ulong)pcVar6 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff00),type,
               (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    testing::Message::~Message((Message *)0x16274c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1627a1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((char *)in_stack_fffffffffffffee8,
             (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_80);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
    in_stack_fffffffffffffee8 =
         (string *)testing::AssertionResult::failure_message((AssertionResult *)0x162837);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff00),type,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffef0),
               (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    testing::Message::~Message((Message *)0x162894);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1628ec);
  cVar5 = decode_utf8(in_stack_fffffffffffffee8,
                      (size_t *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
            ((char *)in_stack_fffffffffffffee8,(char *)CONCAT44(cVar5,in_stack_fffffffffffffee0),
             (char32_t *)in_stack_fffffffffffffed8,
             (char32_t *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  bVar3 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff50);
  uVar8 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffee0);
  if (!bVar3) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
    in_stack_fffffffffffffed8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x1629b4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff00),type,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffef0),
               (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(char *)CONCAT44(cVar5,uVar8));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    testing::Message::~Message((Message *)0x162a08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x162a5a);
  std::__cxx11::string::size();
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffee8,(char *)CONCAT44(cVar5,uVar8),
             (unsigned_long *)in_stack_fffffffffffffed8,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  iVar4 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
  uVar7 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffed4);
  if (!bVar3) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff00));
    testing::AssertionResult::failure_message((AssertionResult *)0x162af6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff00),type,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffef0),iVar4,(char *)CONCAT44(cVar5,uVar8)
              );
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar7,in_stack_fffffffffffffed0));
    testing::Message::~Message((Message *)0x162b42);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x162b8e);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void testEncodeDecode(char32_t codepoint, const std::string &expect_utf8) {
    std::string buffer;
    size_t len = encode_utf8(codepoint, buffer);
    EXPECT_EQ(len, expect_utf8.size());
    EXPECT_EQ(buffer, expect_utf8);

    size_t at = 0;
    char32_t decoded = decode_utf8(expect_utf8, at);
    EXPECT_EQ(decoded, codepoint);
    EXPECT_EQ(at, expect_utf8.size() - 1);
}